

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcEdgeLogLikelihoodsByPartition
          (BeagleCPU4StateImpl<double,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *categoryWeightsIndices,int *stateFrequenciesIndices,
          int *cumulativeScaleIndices,int *partitionIndices,int partitionCount,
          double *outSumLogLikelihoodByPartition)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  long in_stack_00000010;
  double sum13;
  double sum12;
  double sum11;
  double sum10;
  double p13;
  double p12;
  double p11;
  double p10;
  double *partials1;
  int k_1;
  double m133;
  double m132;
  double m131;
  double m130;
  double m123;
  double m122;
  double m121;
  double m120;
  double m113;
  double m112;
  double m111;
  double m110;
  double m103;
  double m102;
  double m101;
  double m100;
  double weight_1;
  int v_1;
  int u_1;
  int l_1;
  int w_1;
  double *partialsChild;
  int stateChild;
  int k;
  double weight;
  int u;
  int l;
  int w;
  int v;
  int *statesChild;
  double *wt;
  double *transMatrix;
  double *partialsParent;
  int categoryWeightsIndex;
  int probIndex;
  int childIndex;
  int parIndex;
  int endPattern;
  int startPattern;
  int pIndex;
  int p;
  int in_stack_fffffffffffffecc;
  int *in_stack_fffffffffffffed0;
  int *in_stack_fffffffffffffed8;
  int *in_stack_fffffffffffffee0;
  double *in_stack_fffffffffffffee8;
  BeagleCPU4StateImpl<double,_1,_0> *in_stack_fffffffffffffef0;
  double *in_stack_ffffffffffffff00;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 local_8c;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_34;
  
  for (local_34 = 0; local_34 < sum13._0_4_; local_34 = local_34 + 1) {
    iVar16 = *(int *)(in_stack_00000010 + (long)local_34 * 4);
    iVar17 = *(int *)(*(long *)(in_RDI + 0x90) + (long)iVar16 * 4);
    iVar16 = *(int *)(*(long *)(in_RDI + 0x90) + (long)(iVar16 + 1) * 4);
    memset((void *)(*(long *)(in_RDI + 0xe0) + (long)(iVar17 * *(int *)(in_RDI + 0x24)) * 8),0,
           (long)((iVar16 - iVar17) * *(int *)(in_RDI + 0x24)) << 3);
    iVar18 = *(int *)(in_RDX + (long)local_34 * 4);
    lVar19 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)*(int *)(in_RSI + (long)local_34 * 4) * 8);
    lVar20 = *(long *)(*(long *)(in_RDI + 0xd8) + (long)*(int *)(in_RCX + (long)local_34 * 4) * 8);
    lVar21 = *(long *)(*(long *)(in_RDI + 0xa0) + (long)*(int *)(in_R8 + (long)local_34 * 4) * 8);
    if ((iVar18 < *(int *)(in_RDI + 0x10)) &&
       (*(long *)(*(long *)(in_RDI + 0xb8) + (long)iVar18 * 8) != 0)) {
      lVar22 = *(long *)(*(long *)(in_RDI + 0xb8) + (long)iVar18 * 8);
      local_74 = iVar17 << 2;
      local_78 = 0;
      for (local_7c = 0; local_7c < *(int *)(in_RDI + 0x34); local_7c = local_7c + 1) {
        local_80 = iVar17 << 2;
        uVar1 = *(ulong *)(lVar21 + (long)local_7c * 8);
        for (local_8c = iVar17; local_8c < iVar16; local_8c = local_8c + 1) {
          iVar18 = *(int *)(lVar22 + (long)local_8c * 4);
          auVar23._8_8_ = 0;
          auVar23._0_8_ = uVar1;
          auVar59._8_8_ = 0;
          auVar59._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_80 * 8);
          auVar43._8_8_ = 0;
          auVar43._0_8_ =
               *(double *)(lVar20 + (long)(local_78 + iVar18) * 8) *
               *(double *)(lVar19 + (long)local_74 * 8);
          auVar27 = vfmadd213sd_fma(auVar23,auVar43,auVar59);
          *(long *)(*(long *)(in_RDI + 0xe0) + (long)local_80 * 8) = auVar27._0_8_;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = uVar1;
          auVar60._8_8_ = 0;
          auVar60._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)(local_80 + 1) * 8);
          auVar44._8_8_ = 0;
          auVar44._0_8_ =
               *(double *)(lVar20 + (long)(local_78 + 5 + iVar18) * 8) *
               *(double *)(lVar19 + (long)(local_74 + 1) * 8);
          auVar27 = vfmadd213sd_fma(auVar24,auVar44,auVar60);
          *(long *)(*(long *)(in_RDI + 0xe0) + (long)(local_80 + 1) * 8) = auVar27._0_8_;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = uVar1;
          auVar61._8_8_ = 0;
          auVar61._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)(local_80 + 2) * 8);
          auVar45._8_8_ = 0;
          auVar45._0_8_ =
               *(double *)(lVar20 + (long)(local_78 + 10 + iVar18) * 8) *
               *(double *)(lVar19 + (long)(local_74 + 2) * 8);
          auVar27 = vfmadd213sd_fma(auVar25,auVar45,auVar61);
          *(long *)(*(long *)(in_RDI + 0xe0) + (long)(local_80 + 2) * 8) = auVar27._0_8_;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = uVar1;
          auVar62._8_8_ = 0;
          auVar62._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)(local_80 + 3) * 8);
          auVar46._8_8_ = 0;
          auVar46._0_8_ =
               *(double *)(lVar20 + (long)(local_78 + 0xf + iVar18) * 8) *
               *(double *)(lVar19 + (long)(local_74 + 3) * 8);
          auVar27 = vfmadd213sd_fma(auVar26,auVar46,auVar62);
          *(long *)(*(long *)(in_RDI + 0xe0) + (long)(local_80 + 3) * 8) = auVar27._0_8_;
          local_80 = local_80 + 4;
          local_74 = local_74 + 4;
        }
        local_78 = local_78 + 0x14;
        if (*(int *)(in_RDI + 0x1c) != 0) {
          local_74 = *(int *)(in_RDI + 0x1c) * 4 + local_74;
        }
        local_74 = ((*(int *)(in_RDI + 0x14) - iVar16) + iVar17) * 4 + local_74;
      }
    }
    else {
      lVar22 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)iVar18 * 8);
      local_9c = 0;
      for (local_a0 = 0; local_a0 < *(int *)(in_RDI + 0x34); local_a0 = local_a0 + 1) {
        local_a4 = iVar17 << 2;
        local_a8 = local_a0 * *(int *)(in_RDI + 0x18) * 4 + iVar17 * 4;
        uVar1 = *(ulong *)(lVar21 + (long)local_a0 * 8);
        uVar2 = *(ulong *)(lVar20 + (long)local_9c * 8);
        dVar3 = *(double *)(lVar20 + (long)(local_9c + 1) * 8);
        uVar4 = *(ulong *)(lVar20 + (long)(local_9c + 2) * 8);
        uVar5 = *(ulong *)(lVar20 + (long)(local_9c + 3) * 8);
        uVar6 = *(ulong *)(lVar20 + (long)(local_9c + 5) * 8);
        dVar7 = *(double *)(lVar20 + (long)(local_9c + 6) * 8);
        uVar8 = *(ulong *)(lVar20 + (long)(local_9c + 7) * 8);
        uVar9 = *(ulong *)(lVar20 + (long)(local_9c + 8) * 8);
        uVar10 = *(ulong *)(lVar20 + (long)(local_9c + 10) * 8);
        in_stack_ffffffffffffff00 = *(double **)(lVar20 + (long)(local_9c + 0xb) * 8);
        uVar11 = *(ulong *)(lVar20 + (long)(local_9c + 0xc) * 8);
        in_stack_fffffffffffffef0 =
             *(BeagleCPU4StateImpl<double,_1,_0> **)(lVar20 + (long)(local_9c + 0xd) * 8);
        in_stack_fffffffffffffee8 = *(double **)(lVar20 + (long)(local_9c + 0xf) * 8);
        in_stack_fffffffffffffee0 = *(int **)(lVar20 + (long)(local_9c + 0x10) * 8);
        in_stack_fffffffffffffed8 = *(int **)(lVar20 + (long)(local_9c + 0x11) * 8);
        in_stack_fffffffffffffed0 = *(int **)(lVar20 + (long)(local_9c + 0x12) * 8);
        for (in_stack_fffffffffffffecc = iVar17; in_stack_fffffffffffffecc < iVar16;
            in_stack_fffffffffffffecc = in_stack_fffffffffffffecc + 1) {
          uVar12 = *(ulong *)(lVar22 + (long)local_a8 * 8);
          dVar13 = *(double *)(lVar22 + (long)(local_a8 + 1) * 8);
          uVar14 = *(ulong *)(lVar22 + (long)(local_a8 + 2) * 8);
          uVar15 = *(ulong *)(lVar22 + (long)(local_a8 + 3) * 8);
          auVar27._8_8_ = 0;
          auVar27._0_8_ = uVar2;
          auVar47._8_8_ = 0;
          auVar47._0_8_ = uVar12;
          auVar63._8_8_ = 0;
          auVar63._0_8_ = dVar3 * dVar13;
          auVar27 = vfmadd213sd_fma(auVar47,auVar27,auVar63);
          auVar28._8_8_ = 0;
          auVar28._0_8_ = uVar4;
          auVar64._8_8_ = 0;
          auVar64._0_8_ = uVar14;
          auVar27 = vfmadd213sd_fma(auVar64,auVar28,auVar27);
          auVar48._8_8_ = 0;
          auVar48._0_8_ = uVar5;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = uVar15;
          auVar27 = vfmadd213sd_fma(auVar29,auVar48,auVar27);
          auVar30._8_8_ = 0;
          auVar30._0_8_ = uVar6;
          auVar49._8_8_ = 0;
          auVar49._0_8_ = uVar12;
          auVar65._8_8_ = 0;
          auVar65._0_8_ = dVar7 * dVar13;
          auVar28 = vfmadd213sd_fma(auVar49,auVar30,auVar65);
          auVar31._8_8_ = 0;
          auVar31._0_8_ = uVar8;
          auVar66._8_8_ = 0;
          auVar66._0_8_ = uVar14;
          auVar28 = vfmadd213sd_fma(auVar66,auVar31,auVar28);
          auVar50._8_8_ = 0;
          auVar50._0_8_ = uVar9;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = uVar15;
          auVar28 = vfmadd213sd_fma(auVar32,auVar50,auVar28);
          auVar33._8_8_ = 0;
          auVar33._0_8_ = uVar10;
          auVar51._8_8_ = 0;
          auVar51._0_8_ = uVar12;
          auVar67._8_8_ = 0;
          auVar67._0_8_ = (double)in_stack_ffffffffffffff00 * dVar13;
          auVar29 = vfmadd213sd_fma(auVar51,auVar33,auVar67);
          auVar34._8_8_ = 0;
          auVar34._0_8_ = uVar11;
          auVar68._8_8_ = 0;
          auVar68._0_8_ = uVar14;
          auVar29 = vfmadd213sd_fma(auVar68,auVar34,auVar29);
          auVar52._8_8_ = 0;
          auVar52._0_8_ = in_stack_fffffffffffffef0;
          auVar35._8_8_ = 0;
          auVar35._0_8_ = uVar15;
          auVar29 = vfmadd213sd_fma(auVar35,auVar52,auVar29);
          auVar36._8_8_ = 0;
          auVar36._0_8_ = in_stack_fffffffffffffee8;
          auVar53._8_8_ = 0;
          auVar53._0_8_ = uVar12;
          auVar69._8_8_ = 0;
          auVar69._0_8_ = (double)in_stack_fffffffffffffee0 * dVar13;
          auVar30 = vfmadd213sd_fma(auVar53,auVar36,auVar69);
          auVar37._8_8_ = 0;
          auVar37._0_8_ = in_stack_fffffffffffffed8;
          auVar70._8_8_ = 0;
          auVar70._0_8_ = uVar14;
          auVar30 = vfmadd213sd_fma(auVar70,auVar37,auVar30);
          auVar54._8_8_ = 0;
          auVar54._0_8_ = in_stack_fffffffffffffed0;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = uVar15;
          auVar30 = vfmadd213sd_fma(auVar38,auVar54,auVar30);
          auVar39._8_8_ = 0;
          auVar39._0_8_ = uVar1;
          auVar71._8_8_ = 0;
          auVar71._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_a4 * 8);
          auVar55._8_8_ = 0;
          auVar55._0_8_ = auVar27._0_8_ * *(double *)(lVar19 + (long)local_a8 * 8);
          auVar27 = vfmadd213sd_fma(auVar39,auVar55,auVar71);
          *(long *)(*(long *)(in_RDI + 0xe0) + (long)local_a4 * 8) = auVar27._0_8_;
          auVar40._8_8_ = 0;
          auVar40._0_8_ = uVar1;
          auVar72._8_8_ = 0;
          auVar72._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)(local_a4 + 1) * 8);
          auVar56._8_8_ = 0;
          auVar56._0_8_ = auVar28._0_8_ * *(double *)(lVar19 + (long)(local_a8 + 1) * 8);
          auVar27 = vfmadd213sd_fma(auVar40,auVar56,auVar72);
          *(long *)(*(long *)(in_RDI + 0xe0) + (long)(local_a4 + 1) * 8) = auVar27._0_8_;
          auVar41._8_8_ = 0;
          auVar41._0_8_ = uVar1;
          auVar73._8_8_ = 0;
          auVar73._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)(local_a4 + 2) * 8);
          auVar57._8_8_ = 0;
          auVar57._0_8_ = auVar29._0_8_ * *(double *)(lVar19 + (long)(local_a8 + 2) * 8);
          auVar27 = vfmadd213sd_fma(auVar41,auVar57,auVar73);
          *(long *)(*(long *)(in_RDI + 0xe0) + (long)(local_a4 + 2) * 8) = auVar27._0_8_;
          auVar42._8_8_ = 0;
          auVar42._0_8_ = uVar1;
          auVar74._8_8_ = 0;
          auVar74._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)(local_a4 + 3) * 8);
          auVar58._8_8_ = 0;
          auVar58._0_8_ = auVar30._0_8_ * *(double *)(lVar19 + (long)(local_a8 + 3) * 8);
          auVar27 = vfmadd213sd_fma(auVar42,auVar58,auVar74);
          *(long *)(*(long *)(in_RDI + 0xe0) + (long)(local_a4 + 3) * 8) = auVar27._0_8_;
          local_a4 = local_a4 + 4;
          local_a8 = local_a8 + 4;
        }
        local_9c = local_9c + 0x14;
      }
    }
  }
  integrateOutStatesAndScaleByPartition
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
             in_stack_ffffffffffffff00);
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsByPartition(
                                                          const int* parentBufferIndices,
                                                          const int* childBufferIndices,
                                                          const int* probabilityIndices,
                                                          const int* categoryWeightsIndices,
                                                          const int* stateFrequenciesIndices,
                                                          const int* cumulativeScaleIndices,
                                                          const int* partitionIndices,
                                                          int partitionCount,
                                                          double* outSumLogLikelihoodByPartition) {

    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        memset(&integrationTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));

        const int parIndex = parentBufferIndices[p];
        const int childIndex = childBufferIndices[p];
        const int probIndex = probabilityIndices[p];
        const int categoryWeightsIndex = categoryWeightsIndices[p];

        assert(parIndex >= kTipCount);

        const REALTYPE* partialsParent = gPartials[parIndex];
        const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];

        if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

            const int* statesChild = gTipStates[childIndex];
            int v = startPattern * 4; // Index for parent partials
            int w = 0;
            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * 4; // Index in resulting product-partials (summed over categories)
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {

                    const int stateChild = statesChild[k];

                    integrationTmp[u    ] += transMatrix[w            + stateChild] * partialsParent[v    ] * weight;
                    integrationTmp[u + 1] += transMatrix[w + OFFSET*1 + stateChild] * partialsParent[v + 1] * weight;
                    integrationTmp[u + 2] += transMatrix[w + OFFSET*2 + stateChild] * partialsParent[v + 2] * weight;
                    integrationTmp[u + 3] += transMatrix[w + OFFSET*3 + stateChild] * partialsParent[v + 3] * weight;

                    u += 4;
                    v += 4;
                }
                w += OFFSET*4;
                if (kExtraPatterns)
                  v += 4 * kExtraPatterns;
                v += ((kPatternCount - endPattern) + startPattern) * 4;
            }
        } else { // Integrate against a partial at the child
            const REALTYPE* partialsChild = gPartials[childIndex];
        #if 0//
            int v = 0;
        #endif
            int w = 0;
            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * 4;
          #if 1//
          int v = l*kPaddedPatternCount*4 + startPattern * 4;
          #endif
                const REALTYPE weight = wt[l];

                PREFETCH_MATRIX(1,transMatrix,w);

                for(int k = startPattern; k < endPattern; k++) {

                    const REALTYPE* partials1 = partialsChild;

                    PREFETCH_PARTIALS(1,partials1,v);

                    DO_INTEGRATION(1);

                    integrationTmp[u    ] += sum10 * partialsParent[v    ] * weight;
                    integrationTmp[u + 1] += sum11 * partialsParent[v + 1] * weight;
                    integrationTmp[u + 2] += sum12 * partialsParent[v + 2] * weight;
                    integrationTmp[u + 3] += sum13 * partialsParent[v + 3] * weight;

                    u += 4;
                    v += 4;
                }
                w += OFFSET*4;
          #if 0//
                if (kExtraPatterns)
                  v += 4 * kExtraPatterns;
                v += ((kPatternCount - endPattern) + startPattern) * 4;
          #endif//
            }
        }
    }

    integrateOutStatesAndScaleByPartition(integrationTmp, stateFrequenciesIndices, cumulativeScaleIndices, partitionIndices, partitionCount, outSumLogLikelihoodByPartition);
}